

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

BSDFSample * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Float uc,Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this_00;
  Point2<float> args_1;
  Vector3f wo_00;
  Vector3f wo_01;
  bool bVar1;
  int iVar2;
  BxDFFlags flags_00;
  Point2f *u_00;
  float *pfVar3;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  DielectricInterfaceBxDF *in_RSI;
  BSDFSample *in_RDI;
  int in_R8D;
  long *in_FS_OFFSET;
  Float FVar4;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float in_XMM1_Da;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Vector3<float> VVar17;
  SampledSpectrum SVar18;
  BxDFFlags flags;
  BSDFSample bs_1;
  Point2f u_1;
  Float uc_1;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> interface;
  PhaseFunctionSample ps;
  Float zp;
  Float dz;
  Float sigma_t;
  Float q;
  Float rrBeta;
  int depth;
  HGPhaseFunction phase;
  Float z;
  Float pdf;
  SampledSpectrum f;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  Vector3f w;
  BSDFSample bs;
  bool enteredTop;
  bool flipWi;
  Vector3f *in_stack_fffffffffffffd58;
  float in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  float in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  float in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  Float local_284;
  undefined8 in_stack_fffffffffffffd88;
  Vector3f *wo_02;
  StatRegisterer *this_01;
  BSDFSample *pBVar19;
  undefined8 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined8 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  BxDFReflTransFlags in_stack_fffffffffffffdd8;
  TransportMode in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  Float in_stack_fffffffffffffdec;
  IdealDiffuseBxDF *in_stack_fffffffffffffdf0;
  Tuple3<pbrt::Vector3,_float> local_200;
  float in_stack_fffffffffffffe0c;
  undefined8 in_stack_fffffffffffffe10;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_1e0;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a4;
  float local_19c;
  PhaseFunctionSample local_198;
  _lambda_pbrt__StatsAccumulator___1_ local_175;
  float local_174;
  Float local_170;
  int local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  int local_158;
  HGPhaseFunction local_154;
  Float local_150;
  float local_14c;
  SampledSpectrum local_148;
  Vector3f *local_138;
  undefined8 local_130;
  Point2f *local_128;
  float local_120;
  Point2f *local_118;
  float local_110;
  Vector3f local_108;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Tuple3<pbrt::Vector3,_float> local_e8;
  Tuple3<pbrt::Vector3,_float> local_d4;
  Point2f *local_c8;
  float local_c0;
  Point2f *local_b8;
  float local_b0;
  Point2f *local_a8;
  float local_a0;
  Point2f *local_98;
  float local_90;
  undefined1 local_88 [16];
  Tuple3<pbrt::Vector3,_float> local_78;
  float local_6c;
  byte local_61;
  Point2f *local_60;
  float in_stack_ffffffffffffffa8;
  TransportMode in_stack_ffffffffffffffac;
  Point2f *in_stack_ffffffffffffffb0;
  uint3 in_stack_ffffffffffffffbc;
  Float uc_00;
  undefined4 uVar20;
  undefined4 in_stack_ffffffffffffffe0;
  Point2f *local_c;
  float local_4;
  undefined1 auVar6 [64];
  undefined1 auVar16 [56];
  
  local_c = (Point2f *)vmovlpd_avx(in_ZMM0._0_16_);
  fVar5 = SUB84(local_c,0);
  uVar20 = (undefined4)((ulong)in_RSI >> 0x20);
  if (in_R8D != 3) {
    LogFatal<char_const(&)[39]>
              ((LogLevel)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(char *)in_RSI,(char (*) [39])in_RDI)
    ;
  }
  uc_00 = (Float)(uint)in_stack_ffffffffffffffbc;
  pBVar19 = in_RDI;
  local_4 = in_XMM1_Da;
  if ((*(char *)((long)&in_RSI[4].mfDistrib.alpha_x + 2) != '\0') &&
     (auVar13 = SUB6456(ZEXT1664((undefined1  [16])0x0),8), in_XMM1_Da < 0.0)) {
    VVar17 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    in_stack_ffffffffffffffa8 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar13;
    local_60 = (Point2f *)vmovlpd_avx(auVar6._0_16_);
    uc_00 = (Float)CONCAT13(1,SUB43(uc_00,0));
    in_stack_ffffffffffffffb0 = local_60;
    local_c = local_60;
    local_4 = in_stack_ffffffffffffffa8;
  }
  local_61 = 0.0 < local_4;
  if ((bool)local_61) {
    local_90 = local_4;
    local_98 = local_c;
    local_a0 = local_4;
    local_a8 = local_c;
    auVar13 = (undefined1  [56])0x0;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffffe0;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar20;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar5;
    DielectricInterfaceBxDF::Sample_f
              ((DielectricInterfaceBxDF *)CONCAT44(in_ECX,in_R8D),wo_01,uc_00,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               (BxDFReflTransFlags)in_stack_ffffffffffffffa8);
  }
  else {
    local_b0 = local_4;
    local_b8 = local_c;
    local_c0 = local_4;
    local_c8 = local_c;
    auVar13 = (undefined1  [56])0x0;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffe10;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe0c;
    IdealDiffuseBxDF::Sample_f
              (in_stack_fffffffffffffdf0,wo_00,in_stack_fffffffffffffdec,
               (Point2f *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
  }
  bVar1 = BSDFSample::operator_cast_to_bool((BSDFSample *)local_88);
  if (bVar1) {
    bVar1 = BSDFSample::IsReflection((BSDFSample *)0x835257);
    if (bVar1) {
      if (((uint)uc_00 & 0x1000000) != 0) {
        VVar17 = Tuple3<pbrt::Vector3,_float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        local_e8.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar7._8_56_ = auVar13;
        local_e8._0_8_ = vmovlpd_avx(auVar7._0_16_);
        local_d4._0_8_ = local_e8._0_8_;
        local_d4.z = local_e8.z;
        local_78._0_8_ = local_e8._0_8_;
        local_78.z = local_e8.z;
      }
      memcpy(in_RDI,local_88,0x24);
    }
    else {
      this_01 = (StatRegisterer *)(local_88 + 0x10);
      local_f8.z = local_78.z;
      local_f8.x = local_78.x;
      local_f8.y = local_78.y;
      GetOptions();
      local_110 = local_4;
      local_118 = local_c;
      local_120 = local_4;
      local_128 = local_c;
      VVar17.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(this_01,0);
      VVar17.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffd88;
      VVar17.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
      u_00 = (Point2f *)Hash<int,pbrt::Vector3<float>>(in_stack_fffffffffffffd74,VVar17);
      local_130 = *in_RDX;
      auVar16 = (undefined1  [56])0x0;
      args_1.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffd64;
      args_1.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffd60;
      Hash<float,pbrt::Point2<float>>((float)((ulong)in_stack_fffffffffffffd58 >> 0x20),args_1);
      wo_02 = &local_108;
      RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (uint64_t)in_stack_fffffffffffffd58,0x8353b0);
      local_138 = wo_02;
      AbsCosTheta((Vector3f *)0x8353c7);
      auVar13 = extraout_var;
      SVar18 = SampledSpectrum::operator*
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (Float)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      auVar14._0_8_ = SVar18.values.values._8_8_;
      auVar14._8_56_ = auVar16;
      auVar8._0_8_ = SVar18.values.values._0_8_;
      auVar8._8_56_ = auVar13;
      local_148.values.values._0_8_ = vmovlpd_avx(auVar8._0_16_);
      local_148.values.values._8_8_ = vmovlpd_avx(auVar14._0_16_);
      local_14c = local_6c;
      if ((local_61 & 1) == 0) {
        local_284 = 0.0;
      }
      else {
        local_284 = in_RSI[2].mfDistrib.alpha_x;
      }
      local_150 = local_284;
      HGPhaseFunction::HGPhaseFunction(&local_154,in_RSI[2].mfDistrib.alpha_y);
      for (local_158 = 0; local_158 < (int)(uint)*(byte *)&in_RSI[4].mfDistrib.alpha_x;
          local_158 = local_158 + 1) {
        FVar4 = SampledSpectrum::MaxComponentValue
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        local_15c = FVar4 / local_14c;
        if ((3 < local_158) && (local_15c < 0.25)) {
          local_164 = 0.0;
          local_168 = 1.0 - local_15c;
          pfVar3 = std::max<float>(&local_164,&local_168);
          local_160 = *pfVar3;
          fVar5 = Sample_f::anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          if (fVar5 < local_160) {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
            return pBVar19;
          }
          local_14c = (1.0 - local_160) * local_14c;
        }
        if ((local_f8.z == 0.0) && (!NAN(local_f8.z))) {
          memset(in_RDI,0,0x24);
          BSDFSample::BSDFSample
                    ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          return pBVar19;
        }
        bVar1 = SampledSpectrum::operator_cast_to_bool
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        if (bVar1) {
          local_16c = 0x3f800000;
          Sample_f::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          in_stack_fffffffffffffd74 = local_16c;
          AbsCosTheta((Vector3f *)0x8355ed);
          local_170 = SampleExponential(0.0,1.206131e-38);
          if (local_f8.z <= 0.0) {
            in_stack_fffffffffffffd70 = local_150 - local_170;
          }
          else {
            in_stack_fffffffffffffd70 = local_150 + local_170;
          }
          local_174 = in_stack_fffffffffffffd70;
          if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
               Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') && (iVar2 = __cxa_guard_acquire(), iVar2 != 0)) {
            pbrt::LayeredBxDF::
            Sample_f(pbrt::Vector3,float,pbrt::Point2_const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
            ::{lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_175);
            StatRegisterer::StatRegisterer(this_01,(AccumFunc)wo_02,(PixelAccumFunc)u_00);
            __cxa_guard_release();
          }
          *(long *)(*in_FS_OFFSET + -0x80) = *(long *)(*in_FS_OFFSET + -0x80) + 1;
          if ((local_174 == local_150) && (!NAN(local_174) && !NAN(local_150))) {
            *(long *)(*in_FS_OFFSET + -0x88) = *(long *)(*in_FS_OFFSET + -0x88) + 1;
          }
          if ((local_174 == local_150) && (!NAN(local_174) && !NAN(local_150))) {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
            return pBVar19;
          }
          if ((local_174 <= 0.0) ||
             (auVar13 = (undefined1  [56])0x0, in_RSI[2].mfDistrib.alpha_x <= local_174)) {
            local_150 = Clamp<float,int,float>(local_174,0,in_RSI[2].mfDistrib.alpha_x);
            goto LAB_0083599b;
          }
          VVar17 = Tuple3<pbrt::Vector3,_float>::operator-
                             ((Tuple3<pbrt::Vector3,_float> *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          local_1b0 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar9._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar9._8_56_ = auVar13;
          local_1b8 = vmovlpd_avx(auVar9._0_16_);
          local_1a4 = local_1b8;
          local_19c = local_1b0;
          in_stack_fffffffffffffd6c =
               Sample_f::anon_class_8_1_ba1d750b::operator()
                         ((anon_class_8_1_ba1d750b *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          Sample_f::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          Point2<float>::Point2
                    ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                     SUB84(in_stack_fffffffffffffd58,0));
          HGPhaseFunction::Sample_p((HGPhaseFunction *)this_01,wo_02,u_00);
          bVar1 = PhaseFunctionSample::operator_cast_to_bool(&local_198);
          if (!bVar1) {
LAB_00835849:
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
            return pBVar19;
          }
          auVar13 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
          if ((local_198.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
             (!NAN(local_198.wi.super_Tuple3<pbrt::Vector3,_float>.z))) goto LAB_00835849;
          auVar16 = (undefined1  [56])0x0;
          SVar18 = SampledSpectrum::operator*
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                              (Float)((ulong)in_stack_fffffffffffffd58 >> 0x20));
          auVar15._0_8_ = SVar18.values.values._8_8_;
          auVar15._8_56_ = auVar13;
          auVar10._0_8_ = SVar18.values.values._0_8_;
          auVar10._8_56_ = auVar16;
          local_1d0 = vmovlpd_avx(auVar10._0_16_);
          local_1c8 = vmovlpd_avx(auVar15._0_16_);
          SampledSpectrum::operator*=
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     (SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_14c = local_198.pdf * local_14c;
          local_f8.x = local_198.wi.super_Tuple3<pbrt::Vector3,_float>.x;
          local_f8.y = local_198.wi.super_Tuple3<pbrt::Vector3,_float>.y;
          local_f8.z = local_198.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          local_150 = local_174;
        }
        else {
          fVar5 = in_RSI[2].mfDistrib.alpha_x;
          if ((local_150 != fVar5) || (NAN(local_150) || NAN(fVar5))) {
            in_stack_fffffffffffffd68 = in_RSI[2].mfDistrib.alpha_x;
          }
          else {
            in_stack_fffffffffffffd68 = 0.0;
          }
          local_150 = in_stack_fffffffffffffd68;
          Tr(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          SampledSpectrum::operator*=
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd6c);
LAB_0083599b:
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::TopOrBottomBxDF
                    (&local_1e0);
          if ((local_150 != 0.0) || (NAN(local_150))) {
            TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                      (&local_1e0,in_RSI);
          }
          else {
            TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                      (&local_1e0,(IdealDiffuseBxDF *)(in_RSI + 1));
          }
          in_stack_fffffffffffffd58 = (Vector3f *)&local_138;
          Sample_f::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          in_stack_fffffffffffffd64 =
               Sample_f::anon_class_8_1_ba1d750b::operator()
                         ((anon_class_8_1_ba1d750b *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          Sample_f::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          auVar13 = (undefined1  [56])0x0;
          Point2<float>::Point2
                    ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                     SUB84(in_stack_fffffffffffffd58,0));
          VVar17 = Tuple3<pbrt::Vector3,_float>::operator-
                             ((Tuple3<pbrt::Vector3,_float> *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          auVar11._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar11._8_56_ = auVar13;
          this_00 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                    vmovlpd_avx(auVar11._0_16_);
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                    (this_00,(Vector3f *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (Float)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                     (Point2f *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (TransportMode)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                     (BxDFReflTransFlags)in_stack_fffffffffffffdb0);
          bVar1 = BSDFSample::operator_cast_to_bool((BSDFSample *)&stack0xfffffffffffffdf0);
          if ((!bVar1) || ((local_200.z == 0.0 && (!NAN(local_200.z))))) {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
            return pBVar19;
          }
          SampledSpectrum::operator*=
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     (SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_14c = in_stack_fffffffffffffe0c * local_14c;
          auVar13 = (undefined1  [56])0x0;
          local_f8._0_8_ = local_200._0_8_;
          local_f8.z = local_200.z;
          bVar1 = BSDFSample::IsTransmission((BSDFSample *)0x835b46);
          if (bVar1) {
            bVar1 = SameHemisphere((Vector3f *)&local_c,(Vector3f *)&local_f8);
            flags_00 = GlossyTransmission;
            if (bVar1) {
              flags_00 = GlossyReflection;
            }
            if (((uint)uc_00 & 0x1000000) != 0) {
              VVar17 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
              local_f8.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar12._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar12._8_56_ = auVar13;
              local_f8._0_8_ = vmovlpd_avx(auVar12._0_16_);
            }
            BSDFSample::BSDFSample(in_RDI,&local_148,(Vector3f *)&local_f8,local_14c,flags_00);
            return pBVar19;
          }
          AbsCosTheta((Vector3f *)0x835c01);
          SampledSpectrum::operator*=
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd6c);
        }
      }
      memset(in_RDI,0,0x24);
      BSDFSample::BSDFSample
                ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    }
  }
  else {
    memset(in_RDI,0,0x24);
    BSDFSample::BSDFSample
              ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  }
  return pBVar19;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wo_ for layered BSDF sampling
        bool flipWi = false;
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            flipWi = true;
        }

        // Sample BSDF at entrance interface to get initial direction _w_
        bool enteredTop = wo.z > 0;
        BSDFSample bs =
            enteredTop ? top.Sample_f(wo, uc, u, mode) : bottom.Sample_f(wo, uc, u, mode);
        if (!bs)
            return {};
        if (bs.IsReflection()) {
            if (flipWi)
                bs.wi = -bs.wi;
            return bs;
        }
        Vector3f w = bs.wi;

        // Declare _RNG_ for layered BSDF sampling
        RNG rng(Hash(GetOptions().seed, wo), Hash(uc, u));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Declare common variables for layered BSDF sampling
        SampledSpectrum f = bs.f * AbsCosTheta(bs.wi);
        Float pdf = bs.pdf;
        Float z = enteredTop ? thickness : 0;
        HGPhaseFunction phase(g);

        for (int depth = 0; depth < config.maxDepth; ++depth) {
            // Follow random walk through layeres to sample layered BSDF
            // Possibly terminate layered BSDF sampling with Russian Roulette
            Float rrBeta = f.MaxComponentValue() / pdf;
            if (depth > 3 && rrBeta < 0.25) {
                Float q = std::max<Float>(0, 1 - rrBeta);
                if (r() < q)
                    return {};
                pdf *= 1 - q;
            }
            if (w.z == 0)
                return {};

            if (albedo) {
                // Sample potential scattering event in layered medium
                Float sigma_t = 1;
                Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                Float zp = w.z > 0 ? (z + dz) : (z - dz);
                CHECK_RARE(1e-5, zp == z);
                if (zp == z)
                    return {};
                if (0 < zp && zp < thickness) {
                    // Update path state for valid scattering event between interfaces
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//f *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
f *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
f /= AbsCosTheta(w);
#endif
                    PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                    if (!ps || ps.wi.z == 0)
                        return {};
                    f *= albedo * ps.p;
                    pdf *= ps.pdf;
                    w = ps.wi;
                    z = zp;

                    continue;
                }
                z = Clamp(zp, 0, thickness);
                if (z == 0)
                    DCHECK_LT(w.z, 0);
                else
                    DCHECK_GT(w.z, 0);

            } else {
                // Advance to the other layer interface
                // Bounce back and forth between the top and bottom
                z = (z == thickness) ? 0 : thickness;
                f *= Tr(thickness, w);
            }
            // Initialize _interface_ for current interface surface
            TopOrBottomBxDF<TopBxDF, BottomBxDF> interface;
            if (z == 0)
                interface = &bottom;
            else
                interface = &top;

            // Sample interface BSDF to determine new path direction
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample bs = interface.Sample_f(-w, uc, u, mode);
            if (!bs || bs.wi.z == 0)
                return {};
            f *= bs.f;
            pdf *= bs.pdf;
            w = bs.wi;

            // Return _BSDFSample_ if path has left the layers
            if (bs.IsTransmission()) {
                BxDFFlags flags = SameHemisphere(wo, w) ? BxDFFlags::GlossyReflection
                                                        : BxDFFlags::GlossyTransmission;
                if (flipWi)
                    w = -w;
                return BSDFSample(f, w, pdf, flags);
            }

            // Scale _f_ by cosine term after scattering at the interface
            f *= AbsCosTheta(bs.wi);
        }
        return {};
    }